

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplace_back<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,Rule *args)

{
  iterator __dest;
  void *in_RSI;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *in_RDI;
  Rule *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    __dest = end(in_RDI);
    memcpy(__dest,in_RSI,0x48);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }